

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

Eso_Man_t * Eso_ManAlloc(Gia_Man_t *pGia)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Eso_Man_t *pEVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  Hsh_VecMan_t *p;
  int *piVar7;
  Vec_Wec_t *pVVar8;
  uint *__ptr;
  int iVar9;
  int iVar10;
  bool bVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  
  pEVar4 = (Eso_Man_t *)calloc(1,0x40);
  pEVar4->pGia = pGia;
  pVVar12 = pGia->vCis;
  uVar1 = pVVar12->nSize;
  pEVar4->nVars = uVar1;
  pEVar4->Cube1 = 1000000000;
  iVar10 = pGia->nObjs;
  pVVar5 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar10 - 1U) {
    iVar9 = iVar10;
  }
  pVVar5->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar5->pArray = pVVar6;
  pVVar5->nSize = iVar10;
  pEVar4->vEsops = pVVar5;
  p = (Hsh_VecMan_t *)calloc(1,0x48);
  uVar14 = 999;
  while( true ) {
    do {
      uVar13 = uVar14;
      uVar14 = uVar13 + 1;
    } while ((uVar13 & 1) != 0);
    if (uVar14 < 9) break;
    iVar10 = 5;
    while (uVar14 % (iVar10 - 2U) != 0) {
      uVar3 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar14 < uVar3) goto LAB_0073ed09;
    }
  }
LAB_0073ed09:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar13) {
    uVar3 = uVar14;
  }
  pVVar6->nCap = uVar3;
  piVar7 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar14;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar14 << 2);
  }
  p->vTable = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 4000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(16000);
  pVVar6->pArray = piVar7;
  p->vData = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  p->vMap = pVVar6;
  pEVar4->pHash = p;
  pVVar8 = (Vec_Wec_t *)malloc(0x10);
  iVar10 = 8;
  if (6 < uVar1) {
    iVar10 = uVar1 + 1;
  }
  pVVar8->nCap = iVar10;
  if (iVar10 == 0) {
    pVVar6 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = (Vec_Int_t *)calloc((long)iVar10,0x10);
  }
  pVVar8->pArray = pVVar6;
  pVVar8->nSize = uVar1 + 1;
  pEVar4->vCubes = pVVar8;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar14 = uVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar14;
  lVar15 = (long)(int)uVar14;
  if (uVar14 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar15 * 4);
  }
  pVVar6->pArray = piVar7;
  pEVar4->vCube1 = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar14;
  if (uVar14 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar15 * 4);
  }
  pVVar6->pArray = piVar7;
  pEVar4->vCube2 = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar14;
  if (uVar14 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(lVar15 << 2);
  }
  pVVar6->pArray = piVar7;
  pEVar4->vCube = pVVar6;
  if (0 < (int)uVar1) {
    lVar15 = 0;
    do {
      iVar10 = pVVar12->pArray[lVar15];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar10 == 0) {
        return pEVar4;
      }
      uVar1 = (int)lVar15 * 2;
      uVar14 = 0;
      bVar2 = true;
      do {
        bVar11 = bVar2;
        __ptr = (uint *)pVVar6->pArray;
        if (pVVar6->nCap < 1) {
          if (__ptr == (uint *)0x0) {
            __ptr = (uint *)malloc(4);
          }
          else {
            __ptr = (uint *)realloc(__ptr,4);
          }
          pVVar6->pArray = (int *)__ptr;
          if (__ptr == (uint *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar6->nCap = 1;
        }
        *__ptr = uVar14 | uVar1;
        pVVar6->nSize = 1;
        Hsh_VecManAdd(p,pVVar6);
        uVar14 = 1;
        bVar2 = false;
      } while (bVar11);
      if (pVVar5->nSize <= iVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar5->pArray + iVar10,uVar1);
      lVar15 = lVar15 + 1;
      pVVar12 = pGia->vCis;
    } while (lVar15 < pVVar12->nSize);
  }
  return pEVar4;
}

Assistant:

Eso_Man_t * Eso_ManAlloc( Gia_Man_t * pGia )
{
    int i, n, Id;
    Eso_Man_t * p = ABC_CALLOC( Eso_Man_t, 1 );
    p->pGia   = pGia;
    p->nVars  = Gia_ManCiNum(pGia);
    p->Cube1  = ABC_INFINITY;
    p->vEsops = Vec_WecStart( Gia_ManObjNum(pGia) );
    p->pHash  = Hsh_VecManStart( 1000 );
    p->vCubes = Vec_WecStart(Gia_ManCiNum(pGia)+1);
    p->vCube1 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube2 = Vec_IntAlloc(Gia_ManCiNum(pGia));
    p->vCube  = Vec_IntAlloc(Gia_ManCiNum(pGia));
    Gia_ManForEachCiId( pGia, Id, i )
    {
        for ( n = 0; n < 2; n++ )
        {
            Vec_IntFill( p->vCube, 1, Abc_Var2Lit(i, n) );
            Hsh_VecManAdd( p->pHash, p->vCube );
        }
        Vec_IntPush( Vec_WecEntry(p->vEsops, Id), Abc_Var2Lit(i, 0) );
    }
    return p;
}